

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O2

void testMultiPartFileMixingBasic(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled) multi-part file"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_183ce9::testWriteRead(1,1,0x32,tempDir);
  anon_unknown.dwarf_183ce9::testWriteRead(2,2,100,tempDir);
  anon_unknown.dwarf_183ce9::testWriteRead(5,3,0xfa,tempDir);
  anon_unknown.dwarf_183ce9::testWriteRead(0x32,4,0x9c4,tempDir);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void testMultiPartFileMixingBasic (const std::string & tempDir)
{
    try
    {
        cout << "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled)"
                " multi-part file" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        testWriteRead ( 1, 1,   50, tempDir);
        testWriteRead ( 2, 2,  100, tempDir);
        testWriteRead ( 5, 3,  250, tempDir);
        testWriteRead (50, 4, 2500, tempDir);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}